

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O2

size_t __thiscall
bidfx_public_api::tools::ByteBuffer::ReadBytes(ByteBuffer *this,OutputStream *output_buf,size_t len)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  
  CheckBufferHasData(this,len);
  sVar2 = len;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    bVar1 = GetNextByte(this);
    (**output_buf->_vptr_OutputStream)(output_buf,(ulong)bVar1);
  }
  return len;
}

Assistant:

size_t ByteBuffer::ReadBytes(OutputStream& output_buf, size_t len)
{
    CheckBufferHasData(len);
    size_t num_bytes = 0;
    for (; num_bytes < len; num_bytes++)
    {
        output_buf.WriteByte(GetNextByte());
    }
    return num_bytes;
}